

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager_test.cpp
# Opt level: O0

void __thiscall
JobManagerTestSuite_StartCancel_Test::TestBody(JobManagerTestSuite_StartCancel_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  initializer_list<unsigned_long> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<unsigned_char> __l_01;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  char *pcVar5;
  char *pcVar6;
  CommissionerAppMock *pCVar7;
  MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_00;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *pTVar8;
  ReturnAction<ot::commissioner::Error> *action_1;
  element_type *peVar9;
  MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *pMVar10;
  TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *pTVar11;
  MockSpec<void_()> *pMVar12;
  TypedExpectation<void_()> *pTVar13;
  int *this_01;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var14;
  WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:295:30),_0UL>
  WVar15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_1f10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e10;
  string local_1b78;
  AssertHelper local_1b58;
  Message local_1b50;
  undefined1 local_1b48 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1b18;
  Message local_1b10;
  undefined1 local_1b08 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_1ad8;
  Message local_1ad0;
  bool local_1ac1;
  undefined1 local_1ac0 [8];
  AssertionResult gtest_ar_;
  Job *job;
  iterator __end1;
  iterator __begin1;
  JobPool *__range1;
  type local_1a88;
  Action<void_()> local_1a80;
  WithoutMatchers local_1a59;
  MockSpec<void_()> local_1a58;
  type local_1a48;
  type local_1a38;
  undefined1 local_1a28 [40];
  Matcher<unsigned_short> local_1a00;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_19e8;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_19d0;
  MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  local_19b8;
  undefined1 local_1964;
  bool local_1963 [2];
  WithoutMatchers local_1961;
  undefined1 auStack_1960 [4];
  bool shouldStop;
  bool wasThreadRunning;
  Error local_1950;
  ReturnAction<ot::commissioner::Error> local_1928;
  undefined1 local_1918 [40];
  Matcher<unsigned_short> local_18f0;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_18d8;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_18c0;
  MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  local_18a8;
  AssertHelper local_1858;
  Message local_1850;
  int local_1844;
  undefined1 local_1840 [8];
  AssertionResult gtest_ar_13;
  Message local_1828;
  undefined1 local_1820 [8];
  ChannelMaskEntry local_1818;
  pointer local_17f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_17f0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_17d3;
  undefined1 local_17d2;
  allocator local_17d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_17d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17c8;
  iterator local_17a8;
  pointer local_17a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1798;
  Error local_1780;
  undefined1 local_1758 [8];
  AssertionResult gtest_ar_12;
  WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:295:30),_0UL>
  local_1720;
  undefined1 local_1710 [16];
  testing local_1700 [8];
  uint8_t *local_16f8;
  DoAllAction<testing::internal::WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:295:30),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
  local_16f0;
  Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  local_16d0;
  WithoutMatchers local_16a9;
  Matcher<const_ot::commissioner::Config_&> local_16a8;
  Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> local_1690;
  MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  local_1678;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_1640;
  undefined1 local_1638 [8];
  CommissionerAppMockPtr commissionerAppMocks [3];
  undefined1 local_1600 [6];
  uint8_t camIdx;
  AssertHelper local_15e0;
  Message local_15d8;
  int local_15cc;
  undefined1 local_15c8 [8];
  AssertionResult gtest_ar_11;
  Message local_15b0;
  Status local_15a1;
  UnixTime local_15a0;
  allocator local_1591;
  string local_1590;
  allocator local_1569;
  string local_1568;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1548;
  allocator local_1521;
  string local_1520;
  Timestamp local_1500;
  allocator local_14f1;
  string local_14f0;
  allocator local_14c9;
  string local_14c8;
  allocator local_14a1;
  string local_14a0;
  State local_1480;
  allocator local_1479;
  string local_1478;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1458;
  allocator local_1439;
  string local_1438;
  BorderAgent local_1418;
  BorderRouterId local_129c;
  BorderRouter local_1298;
  Status local_1109;
  undefined1 local_1108 [8];
  AssertionResult gtest_ar_10;
  Message local_10f0;
  int local_10e4;
  undefined1 local_10e0 [8];
  AssertionResult gtest_ar_9;
  Message local_10c8;
  Status local_10ba;
  allocator local_10b9;
  string local_10b8;
  allocator local_1091;
  string local_1090;
  DomainId local_1070;
  NetworkId local_106c;
  Network local_1068;
  Status local_1001;
  undefined1 local_1000 [8];
  AssertionResult gtest_ar_8;
  Message local_fe8;
  int local_fdc;
  undefined1 local_fd8 [8];
  AssertionResult gtest_ar_7;
  Message local_fc0;
  Status local_fb1;
  UnixTime local_fb0;
  allocator local_fa1;
  string local_fa0;
  allocator local_f79;
  string local_f78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f58;
  allocator local_f31;
  string local_f30;
  Timestamp local_f10;
  allocator local_f01;
  string local_f00;
  allocator local_ed9;
  string local_ed8;
  allocator local_eb1;
  string local_eb0;
  State local_e90;
  allocator local_e89;
  string local_e88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e68;
  allocator local_e49;
  string local_e48;
  BorderAgent local_e28;
  BorderRouterId local_cac;
  BorderRouter local_ca8;
  Status local_b19;
  undefined1 local_b18 [8];
  AssertionResult gtest_ar_6;
  Message local_b00;
  int local_af4;
  undefined1 local_af0 [8];
  AssertionResult gtest_ar_5;
  Message local_ad8;
  Status local_aca;
  allocator local_ac9;
  string local_ac8;
  allocator local_aa1;
  string local_aa0;
  DomainId local_a80;
  NetworkId local_a7c;
  Network local_a78;
  Status local_a11;
  undefined1 local_a10 [8];
  AssertionResult gtest_ar_4;
  Message local_9f8;
  int local_9ec;
  undefined1 local_9e8 [8];
  AssertionResult gtest_ar_3;
  Message local_9d0;
  Status local_9c1;
  UnixTime local_9c0;
  allocator local_9b1;
  string local_9b0;
  allocator local_989;
  string local_988;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_968;
  allocator local_941;
  string local_940;
  Timestamp local_920;
  allocator local_911;
  string local_910;
  allocator local_8e9;
  string local_8e8;
  allocator local_8c1;
  string local_8c0;
  State local_8a0;
  allocator local_899;
  string local_898;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_878;
  allocator local_859;
  string local_858;
  BorderAgent local_838;
  BorderRouterId local_6bc;
  BorderRouter local_6b8;
  Status local_529;
  undefined1 local_528 [8];
  AssertionResult gtest_ar_2;
  Message local_510;
  int local_504;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_4e8;
  Message local_4e0;
  Status local_4d2;
  allocator local_4d1;
  string local_4d0;
  allocator local_4a9;
  string local_4a8;
  DomainId local_488;
  NetworkId local_484;
  Network local_480;
  Status local_419;
  undefined1 local_418 [8];
  AssertionResult gtest_ar;
  NetworkId local_400;
  BorderRouterId rid;
  NetworkId nid;
  undefined1 local_3d8 [8];
  TestContext ctx;
  JobManagerTestSuite_StartCancel_Test *this_local;
  
  ctx.mCommissionerAppStaticExpecter.gmock02_Create_150.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  JobManagerTestSuite::TestContext::TestContext((TestContext *)local_3d8);
  JobManagerTestSuite::SetInitialExpectations
            (&this->super_JobManagerTestSuite,(TestContext *)local_3d8);
  rid.mId._2_1_ = 0x31;
  rid.mId._3_1_ = 0x30;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)((long)&rid.mId + 2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)&ctx.mConf.mId.field_2 + 8),__l_01);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_400);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId
            ((BorderRouterId *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 4));
  peVar4 = std::
           __shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_3d8);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_484,0);
  ot::commissioner::persistent_storage::DomainId::DomainId(&local_488,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4a8,"pan1",&local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4d0,"",&local_4d1);
  ot::commissioner::persistent_storage::Network::Network
            (&local_480,&local_484,&local_488,&local_4a8,1,1,1,&local_4d0,0);
  iVar3 = (*(peVar4->super_PersistentStorage)._vptr_PersistentStorage[6])
                    (peVar4,&local_480,&local_400);
  local_419 = (Status)iVar3;
  local_4d2 = kSuccess;
  testing::internal::EqHelper::
  Compare<ot::commissioner::persistent_storage::PersistentStorage::Status,_ot::commissioner::persistent_storage::PersistentStorage::Status,_nullptr>
            ((EqHelper *)local_418,"ctx.mPS->Add(Network{0, 0, \"pan1\", 1, 1, 0x1, \"\", 0}, nid)",
             "PersistentStorage::Status::kSuccess",&local_419,&local_4d2);
  ot::commissioner::persistent_storage::Network::~Network(&local_480);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar2) {
    testing::Message::Message(&local_4e0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
    testing::internal::AssertHelper::AssertHelper
              (&local_4e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
               ,0xfc,pcVar5);
    testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper(&local_4e8);
    testing::Message::~Message(&local_4e0);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_504 = 0;
    testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
              ((EqHelper *)local_500,"nid.mId","0",&local_400.mId,&local_504);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
    if (!bVar2) {
      testing::Message::Message(&local_510);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                 ,0xfd,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_510);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_510);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
    peVar4 = std::
             __shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_3d8);
    ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_6bc,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_858,"127.0.0.1",&local_859);
    local_878.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_878.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_878.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_878);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_898,"1.1",&local_899);
    ot::commissioner::BorderAgent::State::State(&local_8a0,0,0,0,0,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8c0,"",&local_8c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8e8,"",&local_8e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_910,"",&local_911);
    local_920 = (Timestamp)0x0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_940,"",&local_941);
    local_968.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_968.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_968.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_968);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_988,"",&local_989);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9b0,"",&local_9b1);
    ot::commissioner::UnixTime::UnixTime(&local_9c0,0);
    ot::commissioner::BorderAgent::BorderAgent
              (&local_838,&local_858,0x4e21,&local_878,&local_898,local_8a0,&local_8c0,0,&local_8e8,
               &local_910,local_920,0,&local_940,&local_968,&local_988,'\0',0,&local_9b0,local_9c0,
               0xf);
    ot::commissioner::persistent_storage::BorderRouter::BorderRouter
              (&local_6b8,&local_6bc,&local_400,&local_838);
    iVar3 = (*(peVar4->super_PersistentStorage)._vptr_PersistentStorage[7])
                      (peVar4,&local_6b8,
                       (undefined1 *)
                       ((long)&gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl + 4));
    local_529 = (Status)iVar3;
    local_9c1 = kSuccess;
    testing::internal::EqHelper::
    Compare<ot::commissioner::persistent_storage::PersistentStorage::Status,_ot::commissioner::persistent_storage::PersistentStorage::Status,_nullptr>
              ((EqHelper *)local_528,
               "ctx.mPS->Add(BorderRouter{0, nid, BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x0F}}, rid)"
               ,"PersistentStorage::Status::kSuccess",&local_529,&local_9c1);
    ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&local_6b8);
    ot::commissioner::BorderAgent::~BorderAgent(&local_838);
    std::__cxx11::string::~string((string *)&local_9b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_9b1);
    std::__cxx11::string::~string((string *)&local_988);
    std::allocator<char>::~allocator((allocator<char> *)&local_989);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_968);
    std::__cxx11::string::~string((string *)&local_940);
    std::allocator<char>::~allocator((allocator<char> *)&local_941);
    std::__cxx11::string::~string((string *)&local_910);
    std::allocator<char>::~allocator((allocator<char> *)&local_911);
    std::__cxx11::string::~string((string *)&local_8e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
    std::__cxx11::string::~string((string *)&local_8c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
    std::__cxx11::string::~string((string *)&local_898);
    std::allocator<char>::~allocator((allocator<char> *)&local_899);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_878);
    std::__cxx11::string::~string((string *)&local_858);
    std::allocator<char>::~allocator((allocator<char> *)&local_859);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
    if (!bVar2) {
      testing::Message::Message(&local_9d0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_528);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                 ,0x104,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_9d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_9d0);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_9ec = 0;
      testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
                ((EqHelper *)local_9e8,"rid.mId","0",
                 (uint *)((long)&gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl + 4),&local_9ec);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e8);
      if (!bVar2) {
        testing::Message::Message(&local_9f8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_9e8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                   ,0x105,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_9f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_9f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e8);
      peVar4 = std::
               __shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_3d8);
      ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_a7c,0);
      ot::commissioner::persistent_storage::DomainId::DomainId(&local_a80,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_aa0,"pan2",&local_aa1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_ac8,"",&local_ac9);
      ot::commissioner::persistent_storage::Network::Network
                (&local_a78,&local_a7c,&local_a80,&local_aa0,2,2,2,&local_ac8,0);
      iVar3 = (*(peVar4->super_PersistentStorage)._vptr_PersistentStorage[6])
                        (peVar4,&local_a78,&local_400);
      local_a11 = (Status)iVar3;
      local_aca = kSuccess;
      testing::internal::EqHelper::
      Compare<ot::commissioner::persistent_storage::PersistentStorage::Status,_ot::commissioner::persistent_storage::PersistentStorage::Status,_nullptr>
                ((EqHelper *)local_a10,
                 "ctx.mPS->Add(Network{0, 0, \"pan2\", 2, 2, 0x2, \"\", 0}, nid)",
                 "PersistentStorage::Status::kSuccess",&local_a11,&local_aca);
      ot::commissioner::persistent_storage::Network::~Network(&local_a78);
      std::__cxx11::string::~string((string *)&local_ac8);
      std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
      std::__cxx11::string::~string((string *)&local_aa0);
      std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a10);
      if (!bVar2) {
        testing::Message::Message(&local_ad8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_a10);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                   ,0x107,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_ad8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_ad8);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_a10);
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_af4 = 1;
        testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
                  ((EqHelper *)local_af0,"nid.mId","1",&local_400.mId,&local_af4);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_af0);
        if (!bVar2) {
          testing::Message::Message(&local_b00);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_af0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                     ,0x108,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_6.message_,&local_b00);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
          testing::Message::~Message(&local_b00);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_af0);
        peVar4 = std::
                 __shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_3d8);
        ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_cac,0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e48,"127.0.0.1",&local_e49);
        local_e68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_e68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_e68);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e88,"1.1",&local_e89);
        ot::commissioner::BorderAgent::State::State(&local_e90,0,0,0,0,0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_eb0,"",&local_eb1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_ed8,"",&local_ed9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f00,"",&local_f01);
        local_f10 = (Timestamp)0x0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f30,"",&local_f31);
        local_f58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_f58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_f58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_f58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f78,"",&local_f79);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_fa0,"",&local_fa1);
        ot::commissioner::UnixTime::UnixTime(&local_fb0,0);
        ot::commissioner::BorderAgent::BorderAgent
                  (&local_e28,&local_e48,0x4e22,&local_e68,&local_e88,local_e90,&local_eb0,0,
                   &local_ed8,&local_f00,local_f10,0,&local_f30,&local_f58,&local_f78,'\0',0,
                   &local_fa0,local_fb0,0xf);
        ot::commissioner::persistent_storage::BorderRouter::BorderRouter
                  (&local_ca8,&local_cac,&local_400,&local_e28);
        iVar3 = (*(peVar4->super_PersistentStorage)._vptr_PersistentStorage[7])
                          (peVar4,&local_ca8,
                           (undefined1 *)
                           ((long)&gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl + 4));
        local_b19 = (Status)iVar3;
        local_fb1 = kSuccess;
        testing::internal::EqHelper::
        Compare<ot::commissioner::persistent_storage::PersistentStorage::Status,_ot::commissioner::persistent_storage::PersistentStorage::Status,_nullptr>
                  ((EqHelper *)local_b18,
                   "ctx.mPS->Add(BorderRouter{0, nid, BorderAgent{\"127.0.0.1\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x0F}}, rid)"
                   ,"PersistentStorage::Status::kSuccess",&local_b19,&local_fb1);
        ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&local_ca8);
        ot::commissioner::BorderAgent::~BorderAgent(&local_e28);
        std::__cxx11::string::~string((string *)&local_fa0);
        std::allocator<char>::~allocator((allocator<char> *)&local_fa1);
        std::__cxx11::string::~string((string *)&local_f78);
        std::allocator<char>::~allocator((allocator<char> *)&local_f79);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_f58);
        std::__cxx11::string::~string((string *)&local_f30);
        std::allocator<char>::~allocator((allocator<char> *)&local_f31);
        std::__cxx11::string::~string((string *)&local_f00);
        std::allocator<char>::~allocator((allocator<char> *)&local_f01);
        std::__cxx11::string::~string((string *)&local_ed8);
        std::allocator<char>::~allocator((allocator<char> *)&local_ed9);
        std::__cxx11::string::~string((string *)&local_eb0);
        std::allocator<char>::~allocator((allocator<char> *)&local_eb1);
        std::__cxx11::string::~string((string *)&local_e88);
        std::allocator<char>::~allocator((allocator<char> *)&local_e89);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_e68);
        std::__cxx11::string::~string((string *)&local_e48);
        std::allocator<char>::~allocator((allocator<char> *)&local_e49);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b18);
        if (!bVar2) {
          testing::Message::Message(&local_fc0);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_b18);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                     ,0x10f,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_7.message_,&local_fc0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
          testing::Message::~Message(&local_fc0);
        }
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_b18);
        if (gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_fdc = 1;
          testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
                    ((EqHelper *)local_fd8,"rid.mId","1",
                     (uint *)((long)&gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl + 4),&local_fdc);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fd8);
          if (!bVar2) {
            testing::Message::Message(&local_fe8);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_fd8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                       ,0x110,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_8.message_,&local_fe8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
            testing::Message::~Message(&local_fe8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_fd8);
          peVar4 = std::
                   __shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_3d8);
          ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_106c,0);
          ot::commissioner::persistent_storage::DomainId::DomainId(&local_1070,0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1090,"pan3",&local_1091);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_10b8,"",&local_10b9);
          ot::commissioner::persistent_storage::Network::Network
                    (&local_1068,&local_106c,&local_1070,&local_1090,3,3,3,&local_10b8,0);
          iVar3 = (*(peVar4->super_PersistentStorage)._vptr_PersistentStorage[6])
                            (peVar4,&local_1068,&local_400);
          local_1001 = (Status)iVar3;
          local_10ba = kSuccess;
          testing::internal::EqHelper::
          Compare<ot::commissioner::persistent_storage::PersistentStorage::Status,_ot::commissioner::persistent_storage::PersistentStorage::Status,_nullptr>
                    ((EqHelper *)local_1000,
                     "ctx.mPS->Add(Network{0, 0, \"pan3\", 3, 3, 0x3, \"\", 0}, nid)",
                     "PersistentStorage::Status::kSuccess",&local_1001,&local_10ba);
          ot::commissioner::persistent_storage::Network::~Network(&local_1068);
          std::__cxx11::string::~string((string *)&local_10b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_10b9);
          std::__cxx11::string::~string((string *)&local_1090);
          std::allocator<char>::~allocator((allocator<char> *)&local_1091);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1000);
          if (!bVar2) {
            testing::Message::Message(&local_10c8);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1000);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                       ,0x112,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_9.message_,&local_10c8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
            testing::Message::~Message(&local_10c8);
          }
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1000);
          if (gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            local_10e4 = 2;
            testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
                      ((EqHelper *)local_10e0,"nid.mId","2",&local_400.mId,&local_10e4);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10e0);
            if (!bVar2) {
              testing::Message::Message(&local_10f0);
              pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_10e0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                         ,0x113,pcVar5);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_10.message_,&local_10f0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
              testing::Message::~Message(&local_10f0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_10e0);
            peVar4 = std::
                     __shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_3d8);
            ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_129c,0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1438,"127.0.0.1",&local_1439);
            local_1458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_1458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_1458);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1478,"1.1",&local_1479);
            ot::commissioner::BorderAgent::State::State(&local_1480,0,0,0,0,0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_14a0,"",&local_14a1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_14c8,"",&local_14c9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_14f0,"",&local_14f1);
            local_1500 = (Timestamp)0x0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1520,"",&local_1521);
            local_1548.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_1548.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1548.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_1548);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1568,"",&local_1569);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1590,"",&local_1591);
            ot::commissioner::UnixTime::UnixTime(&local_15a0,0);
            pcVar5 = (char *)(ulong)(uint)local_1480;
            ot::commissioner::BorderAgent::BorderAgent
                      (&local_1418,&local_1438,0x4e23,&local_1458,&local_1478,local_1480,&local_14a0
                       ,0,&local_14c8,&local_14f0,local_1500,0,&local_1520,&local_1548,&local_1568,
                       '\0',0,&local_1590,local_15a0,0xf);
            ot::commissioner::persistent_storage::BorderRouter::BorderRouter
                      (&local_1298,&local_129c,&local_400,&local_1418);
            iVar3 = (*(peVar4->super_PersistentStorage)._vptr_PersistentStorage[7])
                              (peVar4,&local_1298,
                               (undefined1 *)
                               ((long)&gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl + 4));
            local_1109 = (Status)iVar3;
            local_15a1 = kSuccess;
            testing::internal::EqHelper::
            Compare<ot::commissioner::persistent_storage::PersistentStorage::Status,_ot::commissioner::persistent_storage::PersistentStorage::Status,_nullptr>
                      ((EqHelper *)local_1108,
                       "ctx.mPS->Add(BorderRouter{0, nid, BorderAgent{\"127.0.0.1\", 20003, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x0F}}, rid)"
                       ,"PersistentStorage::Status::kSuccess",&local_1109,&local_15a1);
            ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&local_1298);
            ot::commissioner::BorderAgent::~BorderAgent(&local_1418);
            std::__cxx11::string::~string((string *)&local_1590);
            std::allocator<char>::~allocator((allocator<char> *)&local_1591);
            std::__cxx11::string::~string((string *)&local_1568);
            std::allocator<char>::~allocator((allocator<char> *)&local_1569);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1548);
            std::__cxx11::string::~string((string *)&local_1520);
            std::allocator<char>::~allocator((allocator<char> *)&local_1521);
            std::__cxx11::string::~string((string *)&local_14f0);
            std::allocator<char>::~allocator((allocator<char> *)&local_14f1);
            std::__cxx11::string::~string((string *)&local_14c8);
            std::allocator<char>::~allocator((allocator<char> *)&local_14c9);
            std::__cxx11::string::~string((string *)&local_14a0);
            std::allocator<char>::~allocator((allocator<char> *)&local_14a1);
            std::__cxx11::string::~string((string *)&local_1478);
            std::allocator<char>::~allocator((allocator<char> *)&local_1479);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1458);
            std::__cxx11::string::~string((string *)&local_1438);
            std::allocator<char>::~allocator((allocator<char> *)&local_1439);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1108);
            if (!bVar2) {
              testing::Message::Message(&local_15b0);
              pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1108);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                         ,0x11a,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_11.message_,&local_15b0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
              testing::Message::~Message(&local_15b0);
            }
            gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1108);
            if (gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              local_15cc = 2;
              testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
                        ((EqHelper *)local_15c8,"rid.mId","2",
                         (uint *)((long)&gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl + 4),&local_15cc);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15c8)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_15d8);
                pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_15c8);
                testing::internal::AssertHelper::AssertHelper
                          (&local_15e0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x11b,pcVar6);
                testing::internal::AssertHelper::operator=(&local_15e0,&local_15d8);
                testing::internal::AssertHelper::~AssertHelper(&local_15e0);
                testing::Message::~Message(&local_15d8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_15c8);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)local_1600,".",
                         (allocator *)
                         ((long)&commissionerAppMocks[2].
                                 super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 7));
              JobManagerTestSuite::Init
                        (&this->super_JobManagerTestSuite,(TestContext *)local_3d8,
                         (string *)local_1600);
              std::__cxx11::string::~string((string *)local_1600);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&commissionerAppMocks[2].
                                 super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 7));
              commissionerAppMocks[2].
              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
              _6_1_ = 0;
              local_1640 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1638;
              pCVar7 = (CommissionerAppMock *)operator_new(0x1838);
              memset(pCVar7,0,0x1838);
              CommissionerAppMock::CommissionerAppMock(pCVar7);
              std::shared_ptr<CommissionerAppMock>::shared_ptr<CommissionerAppMock,void>
                        ((shared_ptr<CommissionerAppMock> *)local_1638,pCVar7);
              p_Var1 = &commissionerAppMocks[0].
                        super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
              local_1640 = p_Var1;
              pCVar7 = (CommissionerAppMock *)operator_new(0x1838);
              memset(pCVar7,0,0x1838);
              CommissionerAppMock::CommissionerAppMock(pCVar7);
              std::shared_ptr<CommissionerAppMock>::shared_ptr<CommissionerAppMock,void>
                        ((shared_ptr<CommissionerAppMock> *)p_Var1,pCVar7);
              p_Var1 = &commissionerAppMocks[1].
                        super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
              local_1640 = p_Var1;
              pCVar7 = (CommissionerAppMock *)operator_new(0x1838);
              memset(pCVar7,0,0x1838);
              CommissionerAppMock::CommissionerAppMock(pCVar7);
              std::shared_ptr<CommissionerAppMock>::shared_ptr<CommissionerAppMock,void>
                        ((shared_ptr<CommissionerAppMock> *)p_Var1,pCVar7);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_1690,(AnythingMatcher *)&testing::_);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_16a8,(AnythingMatcher *)&testing::_);
              CommissionerAppStaticExpecter::gmock_Create
                        (&local_1678,
                         (CommissionerAppStaticExpecter *)
                         &ctx.mDefaultCommissioner.
                          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,&local_1690,&local_16a8);
              testing::internal::GetWithoutMatchers();
              this_00 = testing::internal::
                        MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                        ::operator()(&local_1678,&local_16a9,(void *)0x0);
              pTVar8 = testing::internal::
                       MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                       ::InternalExpectedAt
                                 (this_00,
                                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                  ,0x124,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
              pTVar8 = testing::internal::
                       TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                       ::Times(pTVar8,3);
              local_1710._0_8_ = local_1638;
              local_1710._8_8_ =
                   (long)&commissionerAppMocks[2].
                          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 6;
              WVar15 = testing::WithArg<0ul,JobManagerTestSuite_StartCancel_Test::TestBody()::__0>
                                 ((anon_class_16_2_c9c4efc7_for_action *)local_1710);
              local_16f8 = WVar15.action.camIdx;
              action_1 = (ReturnAction<ot::commissioner::Error> *)WVar15.action.commissionerAppMocks
              ;
              local_1700 = (testing  [8])action_1;
              ot::commissioner::Error::Error((Error *)&gtest_ar_12.message_);
              testing::Return<ot::commissioner::Error>
                        ((testing *)&local_1720,(Error *)&gtest_ar_12.message_);
              testing::
              DoAll<testing::internal::WithArgsAction<JobManagerTestSuite_StartCancel_Test::TestBody()::__0,0ul>,testing::internal::ReturnAction<ot::commissioner::Error>>
                        (&local_16f0,local_1700,&local_1720,action_1);
              testing::internal::DoAllAction::operator_cast_to_Action
                        (&local_16d0,(DoAllAction *)&local_16f0);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
              ::WillRepeatedly(pTVar8,&local_16d0);
              testing::
              Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
              ::~Action(&local_16d0);
              testing::internal::
              DoAllAction<testing::internal::WithArgsAction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:295:30),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
              ::~DoAllAction(&local_16f0);
              testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction
                        ((ReturnAction<ot::commissioner::Error> *)&local_1720);
              ot::commissioner::Error::~Error((Error *)&gtest_ar_12.message_);
              testing::internal::
              MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
              ::~MockSpec(&local_1678);
              testing::Matcher<const_ot::commissioner::Config_&>::~Matcher(&local_16a8);
              testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>::~Matcher
                        (&local_1690);
              local_17d2 = 1;
              local_17d0 = &local_17c8;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_17c8,"start",&local_17d1);
              local_17d2 = 0;
              local_17a8 = &local_17c8;
              local_17a0 = (pointer)0x1;
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::allocator(&local_17d3);
              __l_00._M_len = (size_type)local_17a0;
              __l_00._M_array = local_17a8;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_1798,__l_00,&local_17d3);
              local_1818.mPage = '\x01';
              local_1818._1_7_ = 0;
              local_1818.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
              local_1818.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3;
              local_1818.mMasks.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = &local_1818.mPage;
              local_17f8 = (pointer)0x3;
              std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)(local_1820 + 7))
              ;
              __l._M_len = (size_type)local_17f8;
              __l._M_array = (iterator)
                             local_1818.mMasks.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_17f0,__l,(allocator<unsigned_long> *)(local_1820 + 7));
              ot::commissioner::JobManager::PrepareJobs
                        (&local_1780,(JobManager *)(ctx.mInterpreter.mCancelPipe + 1),&local_1798,
                         &local_17f0,false);
              local_1820._0_4_ = kNone;
              testing::internal::EqHelper::
              Compare<ot::commissioner::ErrorCode,_ot::commissioner::ErrorCode,_nullptr>
                        ((EqHelper *)local_1758,
                         "ctx.mJobManager.PrepareJobs({\"start\"}, {0x1, 0x2, 0x3}, false).mCode",
                         "ErrorCode::kNone",&local_1780.mCode,(ErrorCode *)local_1820);
              ot::commissioner::Error::~Error(&local_1780);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_17f0);
              std::allocator<unsigned_long>::~allocator
                        ((allocator<unsigned_long> *)(local_1820 + 7));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_1798);
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~allocator(&local_17d3);
              local_1e10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_17a8;
              do {
                local_1e10 = local_1e10 + -1;
                std::__cxx11::string::~string((string *)local_1e10);
              } while (local_1e10 != &local_17c8);
              std::allocator<char>::~allocator((allocator<char> *)&local_17d1);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1758)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_1828);
                pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1758);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x12a,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_13.message_,&local_1828);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_13.message_);
                testing::Message::~Message(&local_1828);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1758);
              local_1844 = 3;
              testing::internal::EqHelper::Compare<unsigned_char,_int,_nullptr>
                        ((EqHelper *)local_1840,"camIdx","3",
                         (uchar *)((long)&commissionerAppMocks[2].
                                          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi + 6),&local_1844);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1840)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_1850);
                pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1840);
                testing::internal::AssertHelper::AssertHelper
                          (&local_1858,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,299,pcVar6);
                testing::internal::AssertHelper::operator=(&local_1858,&local_1850);
                testing::internal::AssertHelper::~AssertHelper(&local_1858);
                testing::Message::~Message(&local_1850);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1840);
              for (commissionerAppMocks[2].
                   super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi._6_1_ = 0;
                  commissionerAppMocks[2].
                  super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._6_1_ < 2;
                  commissionerAppMocks[2].
                  super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._6_1_ = commissionerAppMocks[2].
                                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi._6_1_ + 1) {
                peVar9 = std::
                         __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)&commissionerAppMocks
                                         [(ulong)commissionerAppMocks[2].
                                                 super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount._M_pi._6_1_ - 1].
                                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount);
                testing::internal::AnythingMatcher::operator_cast_to_Matcher
                          (&local_18c0,(AnythingMatcher *)&testing::_);
                testing::internal::AnythingMatcher::operator_cast_to_Matcher
                          (&local_18d8,(AnythingMatcher *)&testing::_);
                testing::internal::AnythingMatcher::operator_cast_to_Matcher
                          (&local_18f0,(AnythingMatcher *)&testing::_);
                CommissionerAppMock::gmock_Start
                          (&local_18a8,peVar9,&local_18c0,&local_18d8,&local_18f0);
                testing::internal::GetWithoutMatchers();
                pMVar10 = testing::internal::
                          MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                          ::operator()(&local_18a8,(WithoutMatchers *)(local_1918 + 0x27),
                                       (void *)0x0);
                pTVar11 = testing::internal::
                          MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                          ::InternalExpectedAt
                                    (pMVar10,
                                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                     ,0x12f,"*commissionerAppMocks[camIdx]","Start(_, _, _)");
                ot::commissioner::Error::Error(&local_1950);
                testing::Return<ot::commissioner::Error>((testing *)&local_1928,&local_1950);
                testing::internal::ReturnAction::operator_cast_to_Action
                          ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                            *)local_1918,(ReturnAction *)&local_1928);
                pCVar7 = (CommissionerAppMock *)local_1918;
                testing::internal::
                TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                ::WillOnce(pTVar11,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                    *)pCVar7);
                testing::
                Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                ::~Action((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                           *)local_1918);
                testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_1928)
                ;
                ot::commissioner::Error::~Error(&local_1950);
                testing::internal::
                MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                ::~MockSpec(&local_18a8);
                testing::Matcher<unsigned_short>::~Matcher(&local_18f0);
                testing::
                Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                ::~Matcher(&local_18d8);
                testing::
                Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                ::~Matcher(&local_18c0);
                peVar9 = std::
                         __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)&commissionerAppMocks
                                         [(ulong)commissionerAppMocks[2].
                                                 super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount._M_pi._6_1_ - 1].
                                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount);
                _auStack_1960 =
                     (FunctionMocker<void_()> *)
                     CommissionerAppMock::gmock_CancelRequests((MockSpec<void_()> *)peVar9,pCVar7);
                testing::internal::GetWithoutMatchers();
                pMVar12 = testing::internal::MockSpec<void_()>::operator()
                                    ((MockSpec<void_()> *)auStack_1960,&local_1961,(void *)0x0);
                pTVar13 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                                    (pMVar12,
                                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                     ,0x130,"*commissionerAppMocks[camIdx]","CancelRequests()");
                testing::internal::TypedExpectation<void_()>::Times(pTVar13,1);
              }
              local_1963[0] = false;
              local_1964 = false;
              peVar9 = std::
                       __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&commissionerAppMocks[1].
                                       super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_19d0,(AnythingMatcher *)&testing::_);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_19e8,(AnythingMatcher *)&testing::_);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_1a00,(AnythingMatcher *)&testing::_);
              CommissionerAppMock::gmock_Start
                        (&local_19b8,peVar9,&local_19d0,&local_19e8,&local_1a00);
              testing::internal::GetWithoutMatchers();
              pMVar10 = testing::internal::
                        MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        ::operator()(&local_19b8,(WithoutMatchers *)(local_1a28 + 0x27),(void *)0x0)
              ;
              pTVar11 = testing::internal::
                        MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        ::InternalExpectedAt
                                  (pMVar10,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x134,"*commissionerAppMocks[2]","Start(_, _, _)");
              pTVar11 = testing::internal::
                        TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        ::Times(pTVar11,1);
              local_1a48.wasThreadRunning = local_1963;
              local_1a48.shouldStop = (bool *)&local_1964;
              local_1a38 = testing::Invoke<JobManagerTestSuite_StartCancel_Test::TestBody()::__1>
                                     (&local_1a48);
              testing::
              Action<ot::commissioner::Error(std::__cxx11::string&,std::__cxx11::string_const&,unsigned_short)>
              ::Action<JobManagerTestSuite_StartCancel_Test::TestBody()::__1,void>
                        ((Action<ot::commissioner::Error(std::__cxx11::string&,std::__cxx11::string_const&,unsigned_short)>
                          *)local_1a28,&local_1a38);
              pCVar7 = (CommissionerAppMock *)local_1a28;
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              ::WillOnce(pTVar11,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                  *)pCVar7);
              testing::
              Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              ::~Action((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                         *)local_1a28);
              testing::internal::
              MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              ::~MockSpec(&local_19b8);
              testing::Matcher<unsigned_short>::~Matcher(&local_1a00);
              testing::
              Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::~Matcher(&local_19e8);
              testing::
              Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::~Matcher(&local_19d0);
              peVar9 = std::
                       __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&commissionerAppMocks[1].
                                       super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount);
              local_1a58.function_mocker_ =
                   (FunctionMocker<void_()> *)
                   CommissionerAppMock::gmock_CancelRequests((MockSpec<void_()> *)peVar9,pCVar7);
              testing::internal::GetWithoutMatchers();
              pMVar12 = testing::internal::MockSpec<void_()>::operator()
                                  (&local_1a58,&local_1a59,(void *)0x0);
              pTVar13 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                                  (pMVar12,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x13b,"*commissionerAppMocks[2]","CancelRequests()");
              pTVar13 = testing::internal::TypedExpectation<void_()>::Times(pTVar13,1);
              __range1 = (JobPool *)&local_1964;
              local_1a88.shouldStop =
                   (bool *)testing::Invoke<JobManagerTestSuite_StartCancel_Test::TestBody()::__2>
                                     ((type *)&__range1);
              testing::Action<void()>::
              Action<JobManagerTestSuite_StartCancel_Test::TestBody()::__2,void>
                        ((Action<void()> *)&local_1a80,&local_1a88);
              testing::internal::TypedExpectation<void_()>::WillOnce(pTVar13,&local_1a80);
              testing::Action<void_()>::~Action(&local_1a80);
              this_01 = ctx.mInterpreter.mCancelPipe + 1;
              __end1 = std::
                       vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>::
                       begin((vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>
                              *)this_01);
              job = (Job *)std::
                           vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>
                           ::end((vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>
                                  *)this_01);
              while( true ) {
                bVar2 = __gnu_cxx::operator!=
                                  (&__end1,(__normal_iterator<ot::commissioner::Job_**,_std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>_>
                                            *)&job);
                if (!bVar2) break;
                p_Var14 = (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)__gnu_cxx::
                             __normal_iterator<ot::commissioner::Job_**,_std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>_>
                             ::operator*(&__end1);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     *(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                       *)&p_Var14->_M_t;
                ot::commissioner::Job::Run
                          ((Job *)gtest_ar_.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl);
                __gnu_cxx::
                __normal_iterator<ot::commissioner::Job_**,_std::vector<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>_>
                ::operator++(&__end1);
              }
              local_1ac1 = (bool)(~local_1964 & 1);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_1ac0,&local_1ac1,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ac0)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_1ad0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__1.message_,(internal *)local_1ac0,
                           (AssertionResult *)"shouldStop","true","false",pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_1ad8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x141,pcVar6);
                testing::internal::AssertHelper::operator=(&local_1ad8,&local_1ad0);
                testing::internal::AssertHelper::~AssertHelper(&local_1ad8);
                std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
                testing::Message::~Message(&local_1ad0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ac0);
              ot::commissioner::JobManager::CancelCommand
                        ((JobManager *)(ctx.mInterpreter.mCancelPipe + 1));
              testing::AssertionResult::AssertionResult<bool_volatile>
                        ((AssertionResult *)local_1b08,local_1963,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b08)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_1b10);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__2.message_,(internal *)local_1b08,
                           (AssertionResult *)"wasThreadRunning","false","true",pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_1b18,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x144,pcVar6);
                testing::internal::AssertHelper::operator=(&local_1b18,&local_1b10);
                testing::internal::AssertHelper::~AssertHelper(&local_1b18);
                std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
                testing::Message::~Message(&local_1b10);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b08);
              testing::AssertionResult::AssertionResult<bool_volatile>
                        ((AssertionResult *)local_1b48,(bool *)&local_1964,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b48)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_1b50);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_1b78,(internal *)local_1b48,(AssertionResult *)"shouldStop",
                           "false","true",pcVar5);
                pcVar5 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_1b58,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x145,pcVar5);
                testing::internal::AssertHelper::operator=(&local_1b58,&local_1b50);
                testing::internal::AssertHelper::~AssertHelper(&local_1b58);
                std::__cxx11::string::~string((string *)&local_1b78);
                testing::Message::~Message(&local_1b50);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b48);
              local_1f10 = &commissionerAppMocks[2].
                            super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount;
              do {
                local_1f10 = local_1f10 + -2;
                std::shared_ptr<CommissionerAppMock>::~shared_ptr
                          ((shared_ptr<CommissionerAppMock> *)local_1f10);
              } while (local_1f10 != (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1638);
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ = 0;
            }
          }
        }
      }
    }
  }
  JobManagerTestSuite::TestContext::~TestContext((TestContext *)local_3d8);
  return;
}

Assistant:

TEST_F(JobManagerTestSuite, StartCancel)
{
    TestContext ctx;
    SetInitialExpectations(ctx);

    // Formally set default PSKc
    ctx.mConf.mPSKc = {'1', '0'};

    using namespace ot::commissioner::persistent_storage;
    // Prepare test data
    NetworkId      nid;
    BorderRouterId rid;

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan1", 1, 1, 0x1, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 0);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 0);

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan2", 2, 2, 0x2, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 1);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20002, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 1);

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan3", 3, 3, 0x3, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 2);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20003, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 2);

    Init(ctx, ".");

    uint8_t                camIdx                  = 0;
    CommissionerAppMockPtr commissionerAppMocks[3] = {CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()}};

    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .Times(3)
        .WillRepeatedly(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMocks[camIdx++]; }),
                  Return(Error{})));

    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"start"}, {0x1, 0x2, 0x3}, false).mCode, ErrorCode::kNone);
    EXPECT_EQ(camIdx, 3);

    for (camIdx = 0; camIdx < 2; ++camIdx)
    {
        EXPECT_CALL(*commissionerAppMocks[camIdx], Start(_, _, _)).WillOnce(Return(Error{}));
        EXPECT_CALL(*commissionerAppMocks[camIdx], CancelRequests()).Times(1);
    }
    volatile bool wasThreadRunning = false;
    volatile bool shouldStop       = false;
    EXPECT_CALL(*commissionerAppMocks[2], Start(_, _, _)).Times(1).WillOnce(Invoke([&]() {
        wasThreadRunning = true;
        while (!shouldStop)
        {
        };
        return Error{};
    }));
    EXPECT_CALL(*commissionerAppMocks[2], CancelRequests()).Times(1).WillOnce(Invoke([&]() { shouldStop = true; }));

    for (auto job : ctx.mJobManager.mJobPool)
    {
        job->Run();
    }
    EXPECT_FALSE(shouldStop);

    ctx.mJobManager.CancelCommand();
    EXPECT_TRUE(wasThreadRunning);
    EXPECT_TRUE(shouldStop);
}